

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MADPComponentFactoredStates.cpp
# Opt level: O0

double __thiscall
MADPComponentFactoredStates::GetInitialStateProbability(MADPComponentFactoredStates *this,Index sI)

{
  pointer puVar1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  double dVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> sfacValues;
  string *in_stack_00000138;
  MADPComponentFactoredStates *in_stack_00000140;
  undefined1 *puVar3;
  MADPComponentFactoredStates *in_stack_ffffffffffffff88;
  undefined1 local_60 [16];
  allocator<char> *in_stack_ffffffffffffffb0;
  char *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  allocator<char> local_31;
  string local_30 [48];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
  AssureInitialized(in_stack_00000140,in_stack_00000138);
  std::__cxx11::string::~string(local_30);
  std::allocator<char>::~allocator(&local_31);
  puVar3 = local_60;
  StateIndexToFactorValueIndices(in_stack_ffffffffffffff88,(Index)((ulong)puVar3 >> 0x20));
  puVar1 = in_RDI[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  dVar2 = (double)(**(code **)(*(long *)puVar1 + 0x40))(puVar1,puVar3);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(in_RDI);
  return dVar2;
}

Assistant:

double MADPComponentFactoredStates::GetInitialStateProbability(Index sI) const
{
    AssureInitialized("GetInitialStateProbability(Index sI)"); 
    vector<Index> sfacValues = StateIndexToFactorValueIndices(sI);
    return(_m_initialStateDistribution->GetProbability(sfacValues) );
}